

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O3

void EncDown(AmpIO *bd,uint qlaNum)

{
  uint8_t mask;
  
  mask = '\x03';
  if (qlaNum == 2) {
    mask = '0';
  }
  AmpIO::WriteDigitalOutput(bd,mask,'3');
  AmpIO::WriteDigitalOutput(bd,mask,'\x11');
  Amp1394_Sleep(1e-05);
  AmpIO::WriteDigitalOutput(bd,mask,'\0');
  Amp1394_Sleep(1e-05);
  AmpIO::WriteDigitalOutput(bd,mask,'\"');
  Amp1394_Sleep(1e-05);
  AmpIO::WriteDigitalOutput(bd,mask,'3');
  return;
}

Assistant:

void EncDown(AmpIO &bd, unsigned int qlaNum)
{
    uint8_t dout_mask = (qlaNum == 2) ? 0x30 : 0x03;
    bd.WriteDigitalOutput(dout_mask, 0x33);
    bd.WriteDigitalOutput(dout_mask, 0x11);
    Amp1394_Sleep(0.00001);
    bd.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.00001);
    bd.WriteDigitalOutput(dout_mask, 0x22);
    Amp1394_Sleep(0.00001);
    bd.WriteDigitalOutput(dout_mask, 0x33);
}